

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llstk.c
# Opt level: O1

DLword * freestackblock(DLword n,StackWord *start68k,int align)

{
  StackWord *pSVar1;
  int iVar2;
  ushort uVar3;
  StackWord *pSVar4;
  StackWord SVar5;
  undefined6 in_register_0000003a;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  StackWord *pSVar10;
  
  if ((n & 1) != 0) {
    error("asking for odd-length stack block");
  }
  pSVar10 = (StackWord *)((ulong)((uint)InterfacePage->endofstack * 2) + (long)Stackspace);
  iVar2 = (int)CONCAT62(in_register_0000003a,n);
  do {
    pSVar4 = start68k;
    if (start68k != (StackWord *)0x0) goto LAB_0012b8ef;
    do {
      pSVar4 = (StackWord *)((ulong)((uint)InterfacePage->stackbase * 2) + (long)Stackspace);
LAB_0012b8ef:
      uVar3 = *(ushort *)((ulong)pSVar4 ^ 2) >> 0xd;
      if (uVar3 == 5) {
LAB_0012b91c:
        SVar5 = *pSVar4;
        do {
          if (SVar5 == (StackWord)0x0) {
            error("FREESIZE = 0");
          }
          pSVar1 = pSVar4 + (ushort)SVar5;
          uVar3 = *(ushort *)((ulong)pSVar1 ^ 2) >> 0xd;
          if (uVar3 == 7) {
            if (pSVar10 <= pSVar1) goto LAB_0012b958;
          }
          else if (uVar3 != 5) goto LAB_0012b958;
          SVar5 = (StackWord)((short)SVar5 + (short)*pSVar1);
        } while( true );
      }
      if (uVar3 == 6) {
        pSVar4 = (StackWord *)((ulong)((uint)(ushort)pSVar4[5] * 2) + (long)Stackspace);
        goto LAB_0012b9ca;
      }
      if (uVar3 != 7) {
        do {
        } while( true );
      }
      if (pSVar4 < pSVar10) goto LAB_0012b91c;
    } while (start68k != (StackWord *)0x0);
LAB_0012b9d6:
    pSVar10 = (StackWord *)extendstack();
    if (pSVar10 == (StackWord *)0x0) {
      warn("freestackblock:StackFull MP9319");
      return (DLword *)0x0;
    }
  } while( true );
LAB_0012b958:
  uVar6 = (uint)(ushort)SVar5;
  if (iVar2 + 800U <= (uint)(ushort)SVar5) {
    if (align < 0) {
      uVar9 = 0x20;
    }
    else {
      uVar8 = (long)pSVar4 - (long)Stackspace >> 1;
      if (0xffff < uVar8) {
        printf("Stack offset is out of range: 0x%tx\n",uVar8);
      }
      uVar9 = (uint)(((uint)uVar8 & 3) != align) * 2 + 0x20;
    }
    if (n == 0) {
      error("creating 0 length stack guard block");
    }
    pSVar10 = pSVar4 + uVar9;
    if ((n & 1) != 0) {
      error("creating odd sized stack guard block");
    }
    *(int *)pSVar10 = iVar2 + -0x20000000;
    *(uint *)pSVar4 = uVar9 + 0xa0000000;
    uVar7 = uVar6 - (uVar9 + iVar2);
    if (uVar7 == 0 || (int)uVar6 < (int)(uVar9 + iVar2)) {
      error("creating 0 length free stack block");
    }
    if ((uVar7 & 1) != 0) {
      error("creating odd length free stack block");
    }
    *(uint *)(pSVar10 + n) = uVar7 & 0xffff | 0xa0000000;
    return (DLword *)pSVar10;
  }
  if (SVar5 == (StackWord)0x0) {
    error("creating 0 length free stack block");
  }
  if (((ushort)SVar5 & 1) != 0) {
    error("creating odd length free stack block");
  }
  *(uint *)pSVar4 = uVar6 | 0xa0000000;
  pSVar4 = pSVar1;
LAB_0012b9ca:
  if (pSVar4 == start68k) goto LAB_0012b9d6;
  goto LAB_0012b8ef;
}

Assistant:

DLword *freestackblock(DLword n, StackWord *start68k, int align)
/* size you want(in DLword) */
/* searching will start68k at here */
/* if Negative,it needn't align */
{
  int wantedsize;
  StackWord *scanptr68k;
  STKBLK *freeptr68k;
  StackWord *easp68k;
  DLword freesize;

  DLword *extendstack(void);

  if (n % 2) error("asking for odd-length stack block");

  /* compute actually size you needed */
  wantedsize = n + STACKAREA_SIZE + MINEXTRASTACKWORDS;

  easp68k = (StackWord *)(NativeAligned2FromStackOffset(InterfacePage->endofstack));

  /*** DEBUG ***/
  S_CHECK(n > 2, "asking for block < 2 words long");
  S_CHECK(start68k != 0, "start68k = 0");
  S_CHECK(start68k >= (StackWord *)NativeAligned2FromStackOffset(InterfacePage->stackbase),
          "start68k before stack base");

STARTOVER:
  if (start68k)
    scanptr68k = start68k;
  else
    scanptr68k = (StackWord *)NativeAligned2FromStackOffset(InterfacePage->stackbase);

SCAN:
  switch ((unsigned)(STKWORD(scanptr68k)->flags)) {
    case STK_FSB: goto FREESCAN;
    case STK_GUARD:
      if ((UNSIGNED)scanptr68k < (UNSIGNED)easp68k) goto FREESCAN;
      if (start68k) {
        scanptr68k = (StackWord *)NativeAligned2FromStackOffset(InterfacePage->stackbase);
        goto SCAN;
      } else
        goto NEWPAGE;
    case STK_FX:
      scanptr68k = (StackWord *)NativeAligned2FromStackOffset(((FX *)scanptr68k)->nextblock);
      break;
    default: {
#ifdef STACKCHECK
      StackWord *orig68k = scanptr68k;
#endif
      while (STKWORD(scanptr68k)->flags != STK_BF) {
        S_WARN(STKWORD(scanptr68k)->flags == STK_NOTFLG, "NOTFLG not on", (void *)scanptr68k);
        scanptr68k = (StackWord *)(((DLword *)scanptr68k) + DLWORDSPER_CELL);
      }

#ifdef STACKCHECK
      if (((Bframe *)scanptr68k)->residual) {
        if (scanptr68k != orig68k) {
          WARN("freestackblock:scanptr68k !=org", printf(":0x%x\n", LAddrFromNative(scanptr68k)));
          return 0; /* ? */
        }
      } else {
        if (((Bframe *)scanptr68k)->ivar != StackOffsetFromNative(orig68k)) {
          WARN("BF doesn't point TopIVAR", printf(":0x%x\n", LAddrFromNative(scanptr68k)));
          return 0; /* ? */
        }
      }
#endif
      /* Used to be a +=, but SunOS4/Sparc compiles it wrong */
      scanptr68k = (StackWord *)((DLword *)scanptr68k + DLWORDSPER_CELL);
      break;
    }
  } /* end switch(scanptr68k */

NEXT:
  if (scanptr68k != start68k) {
    S_CHECK((UNSIGNED)scanptr68k <= (UNSIGNED)easp68k, "scan ptr past end of stack");
    goto SCAN;
  }
NEWPAGE:
  easp68k = (StackWord *)extendstack();
  if (easp68k)
    goto STARTOVER;
  else {
    warn("freestackblock:StackFull MP9319");
    return (0);
  }

FREESCAN:
  freeptr68k = (STKBLK *)scanptr68k;
  freesize = FSB_size(freeptr68k);
FREE:
  scanptr68k = (StackWord *)(((DLword *)freeptr68k) + freesize);
  if (freesize == 0) error("FREESIZE = 0");

  switch ((unsigned)(STKWORD(scanptr68k)->flags)) {
    case STK_FSB: freesize = freesize + FSB_size(scanptr68k); goto FREE;

    case STK_GUARD:
      if ((UNSIGNED)scanptr68k < (UNSIGNED)easp68k) {
        freesize = freesize + FSB_size(scanptr68k);
        goto FREE;
      }
      break;

    default: break;

  } /* end switch(scanp.. */

  if (freesize >= wantedsize) {
    if ((align < 0) || (align == (StackOffsetFromNative(freeptr68k) % DLWORDSPER_QUAD)))
      wantedsize = MINEXTRASTACKWORDS;
    else
      wantedsize = MINEXTRASTACKWORDS + DLWORDSPER_CELL;

    scanptr68k = (StackWord *)(((DLword *)freeptr68k) + wantedsize);

    SETUPGUARDBLOCK(scanptr68k, n);
    MAKEFREEBLOCK(freeptr68k, wantedsize);
    MAKEFREEBLOCK(((DLword *)scanptr68k) + n, freesize - wantedsize - n);
    return ((DLword *)scanptr68k);
  } else
    MAKEFREEBLOCK(freeptr68k, freesize);

  goto NEXT;
}